

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

DynamicProfileInfo * __thiscall Js::FunctionBody::EnsureDynamicProfileInfo(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicProfileInfo **ppDVar4;
  FunctionBody *this_local;
  
  bVar2 = NeedEnsureDynamicProfileInfo(this);
  if (bVar2) {
    ScriptContext::AddDynamicProfileInfo<Memory::WriteBarrierPtr>
              ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext,this,
               &this->dynamicProfileInfo);
    bVar2 = HasExecutionDynamicProfileInfo(this);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xdf2,"(!this->HasExecutionDynamicProfileInfo())",
                                  "!this->HasExecutionDynamicProfileInfo()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffffeff | 0x100;
  }
  ppDVar4 = Memory::WriteBarrierPtr::operator_cast_to_DynamicProfileInfo__
                      ((WriteBarrierPtr *)&this->dynamicProfileInfo);
  return *ppDVar4;
}

Assistant:

DynamicProfileInfo * FunctionBody::EnsureDynamicProfileInfo()
    {
        if (this->NeedEnsureDynamicProfileInfo())
        {
            m_scriptContext->AddDynamicProfileInfo(this, this->dynamicProfileInfo);
            Assert(!this->HasExecutionDynamicProfileInfo());
            this->hasExecutionDynamicProfileInfo = true;
        }

        return this->dynamicProfileInfo;
    }